

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void gai_gatscat_new(int op,Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv,
                    double *locbytes,double *totbytes,void *alpha)

{
  long lVar1;
  global_array_t *pgVar2;
  void **ptr;
  short sVar3;
  ushort uVar4;
  int iVar5;
  C_Integer *pCVar6;
  bool bVar7;
  global_array_t *pgVar8;
  Integer g_a_00;
  Integer *pIVar9;
  logical lVar10;
  uint uVar11;
  long *plVar12;
  long lVar13;
  C_Integer CVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  Integer IVar24;
  int _ndim;
  Integer tproc;
  armci_giov_t desc;
  Integer index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer _index2 [7];
  Integer lo [7];
  Integer ld [6];
  Integer hi [7];
  int local_3b0;
  long local_3a8;
  byte local_399;
  Integer local_398;
  int local_38c;
  Integer *local_388;
  void **local_380;
  Integer local_378;
  void **local_370;
  long local_368;
  int local_360;
  int local_35c;
  Integer *local_358;
  ulong local_350;
  ulong local_348;
  Integer *local_340;
  void *local_338;
  long local_330;
  armci_giov_t local_328;
  Integer local_310;
  Integer local_308;
  int local_2fc;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8 [7];
  ulong local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  ulong local_268;
  void *local_260;
  long local_258 [7];
  long alStack_220 [8];
  long lStack_1e0;
  undefined8 local_1d8;
  Integer local_d8 [8];
  Integer local_98 [6];
  Integer local_68 [7];
  
  lVar1 = g_a + 1000;
  local_35c = op;
  local_338 = subscript;
  local_260 = v;
  local_348 = pnga_nodeid();
  pgVar8 = GA;
  local_2d8 = GA[lVar1].num_rstrctd;
  local_280 = (long)GA[lVar1].p_handle;
  if (local_280 < 0) {
    lVar20 = GAnproc;
    local_398 = local_2d8;
    if (0 < local_2d8) goto LAB_00176786;
  }
  else {
    lVar20 = (long)PGRP_LIST[local_280].map_nproc;
  }
  local_398 = lVar20;
LAB_00176786:
  IVar24 = local_398;
  lVar20 = (long)GA_prealloc_gatscat;
  local_310 = c_flag;
  if (lVar20 == 0) {
    pIVar9 = (Integer *)pnga_malloc(local_398,0x3f2,"ga_gat_header");
    local_340 = (Integer *)pnga_malloc(nv,0x3f2,"ga_gat_list");
    local_388 = (Integer *)pnga_malloc(IVar24,0x3f2,"ga_gat_nelems");
  }
  else {
    if (lVar20 < nv) {
      pnga_error("Gather/scatter vector exceeds allocation length ",lVar20);
    }
    local_340 = GA_list;
    local_388 = GA_elems;
    pIVar9 = GA_header;
    IVar24 = local_398;
  }
  sVar3 = GA[lVar1].ndim;
  local_350 = (ulong)(uint)(int)sVar3;
  local_2f8 = (long)GA[lVar1].type;
  local_360 = GA[lVar1].elemsize;
  local_330 = (long)local_360;
  *totbytes = (double)(local_330 * nv);
  if (0 < IVar24) {
    lVar20 = 0;
    do {
      local_388[lVar20] = 0;
      pIVar9[lVar20] = -1;
      lVar20 = lVar20 + 1;
    } while (IVar24 != lVar20);
  }
  local_368 = (long)(int)sVar3;
  local_358 = pIVar9;
  local_308 = g_a;
  if (nv < 1) {
    iVar15 = 1;
  }
  else {
    memset(local_340,0,nv * 8);
    uVar17 = local_350 & 0xffffffff;
    local_370 = (void **)(g_a * 0x368 + 0xd50a8);
    local_380 = (void **)(g_a * 0x368 + 0xd4ee0);
    iVar15 = 1;
    lVar20 = 0;
    do {
      if (local_310 == 0) {
        pIVar9 = (Integer *)((long)local_338 + lVar20 * local_368 * 8);
      }
      else {
        pIVar9 = local_2c8;
        if (0 < (short)local_368) {
          lVar19 = *(long *)((long)local_338 + lVar20 * 8);
          plVar12 = local_2c8;
          lVar16 = local_368;
          do {
            *plVar12 = (long)*(int *)(lVar19 + -4 + lVar16 * 4) + 1;
            plVar12 = plVar12 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
          pIVar9 = local_2c8;
        }
      }
      lVar10 = pnga_locate(local_308,pIVar9,&local_3a8);
      if (lVar10 == 0) {
        gai_print_subscript("invalid subscript",(int)local_350,pIVar9,"\n");
        pnga_error("failed -element:",lVar20);
      }
      if (0 < local_2d8) {
        local_3a8 = GA[lVar1].rank_rstrctd[local_3a8];
      }
      pgVar2 = GA + lVar1;
      iVar5 = GA[lVar1].distr_type;
      if (iVar5 - 3U < 2) {
        sVar3 = pgVar2->ndim;
        uVar11 = (uint)sVar3;
        lVar19 = (long)(int)local_3a8 % pgVar2->num_blocks[0];
        local_2c8[0] = lVar19;
        if (1 < (int)uVar11) {
          lVar16 = 0;
          do {
            local_3a8 = ((int)local_3a8 - lVar19) /
                        *(long *)((long)local_370 + (long)(GA->dims + lVar16 + -7));
            lVar19 = (long)(int)local_3a8 %
                     *(long *)((long)local_370 + (long)(GA->dims + lVar16 + -6));
            local_2c8[lVar16 + 1] = lVar19;
            lVar16 = lVar16 + 1;
          } while ((ulong)uVar11 - 1 != lVar16);
        }
        if (0 < (short)local_368) {
          uVar18 = 0;
          do {
            local_2c8[uVar18] = local_2c8[uVar18] % (long)pgVar8[lVar1].nblock[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        if (0 < sVar3) {
          uVar18 = 0;
          do {
            (&local_1d8)[uVar18] =
                 local_2c8[uVar18] %
                 (long)*(int *)((long)GA->dims + uVar18 * 4 + (long)local_380 + -0x30);
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
        }
        local_3a8 = (&lStack_1e0)[(int)uVar11];
        if (1 < sVar3) {
          uVar18 = (ulong)(uVar11 - 2);
          do {
            local_3a8 = local_3a8 * *(int *)((long)GA->dims + uVar18 * 4 + (long)local_380 + -0x30)
                        + (&local_1d8)[uVar18];
            bVar7 = 0 < (long)uVar18;
            uVar18 = uVar18 - 1;
          } while (bVar7);
        }
      }
      else if (iVar5 == 2) {
        sVar3 = pgVar2->ndim;
        uVar11 = (uint)sVar3;
        lVar19 = (long)(int)local_3a8 % pgVar2->num_blocks[0];
        local_2c8[0] = lVar19;
        if (1 < (int)uVar11) {
          lVar16 = 0;
          do {
            local_3a8 = ((int)local_3a8 - lVar19) /
                        *(long *)((long)local_370 + (long)(GA->dims + lVar16 + -7));
            lVar19 = (long)(int)local_3a8 %
                     *(long *)((long)local_370 + (long)(GA->dims + lVar16 + -6));
            local_2c8[lVar16 + 1] = lVar19;
            lVar16 = lVar16 + 1;
          } while ((ulong)uVar11 - 1 != lVar16);
        }
        if (0 < (short)local_368) {
          uVar18 = 0;
          do {
            local_2c8[uVar18] = local_2c8[uVar18] % (long)pgVar8[lVar1].nblock[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        if (0 < sVar3) {
          uVar18 = 0;
          do {
            (&local_1d8)[uVar18] =
                 local_2c8[uVar18] %
                 (long)*(int *)((long)GA->dims + uVar18 * 4 + (long)local_380 + -0x30);
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
        }
        local_3a8 = (&lStack_1e0)[(int)uVar11];
        if (1 < sVar3) {
          uVar18 = (ulong)(uVar11 - 2);
          do {
            local_3a8 = local_3a8 * *(int *)((long)GA->dims + uVar18 * 4 + (long)local_380 + -0x30)
                        + (&local_1d8)[uVar18];
            bVar7 = 0 < (long)uVar18;
            uVar18 = uVar18 - 1;
          } while (bVar7);
        }
      }
      else if (iVar5 == 1) {
        local_3a8 = local_3a8 % local_398;
      }
      local_388[local_3a8] = local_388[local_3a8] + 1;
      if ((long)iVar15 < local_388[local_3a8]) {
        iVar15 = (int)local_388[local_3a8];
      }
      IVar24 = local_358[local_3a8];
      local_358[local_3a8] = lVar20;
      local_340[lVar20] = (long)(int)IVar24;
      lVar20 = lVar20 + 1;
    } while (lVar20 != nv);
  }
  *locbytes = (double)(local_388[local_348] * local_330);
  local_380 = (void **)malloc((long)(iVar15 * 2) << 3);
  if (0 < local_398) {
    local_370 = local_380 + iVar15;
    local_268 = (ulong)((int)local_350 - 1);
    uVar11 = (int)local_2f8 - 0x3e9;
    local_290 = (ulong)uVar11;
    local_288 = (long)local_35c;
    local_2f0 = local_308 * 0x368;
    local_2e0 = local_2f0 + 0xd50a8;
    local_278 = local_2f0 + 0xd5068;
    local_2e8 = local_2f0 + 0xd4ee0;
    local_270 = local_2f0 + 0xd4f00;
    local_399 = ~(0x6fU >> ((byte)uVar11 & 0x1f));
    lVar19 = 0;
    pIVar9 = local_388;
    IVar24 = local_310;
    lVar20 = local_368;
    do {
      if (0 < pIVar9[lVar19]) {
        local_3a8 = local_358[lVar19];
        if (-1 < local_3a8) {
          local_3b0 = (int)lVar19;
          local_2d0 = (long)local_3b0;
          lVar16 = 0;
          do {
            g_a_00 = local_308;
            pgVar8 = GA;
            if (IVar24 == 0) {
              pIVar9 = (Integer *)((long)local_338 + local_3a8 * lVar20 * 8);
            }
            else {
              pIVar9 = local_2c8;
              if (0 < (short)lVar20) {
                lVar13 = *(long *)((long)local_338 + local_3a8 * 8);
                plVar12 = local_2c8;
                do {
                  *plVar12 = (long)*(int *)(lVar13 + -4 + lVar20 * 4) + 1;
                  plVar12 = plVar12 + 1;
                  lVar20 = lVar20 + -1;
                } while (lVar20 != 0);
                pIVar9 = local_2c8;
              }
            }
            if (GA[lVar1].distr_type == 0) {
              uVar4 = GA[lVar1].ndim;
              uVar17 = (ulong)(short)uVar4;
              iVar15 = GA[lVar1].distr_type;
              local_348 = uVar17;
              if (iVar15 - 1U < 3) {
                uVar18 = local_2d0 % GA[lVar1].num_blocks[0];
                local_1d8._0_4_ = (int)uVar18;
                if (1 < (short)uVar4) {
                  uVar18 = uVar18 & 0xffffffff;
                  lVar13 = 0;
                  lVar20 = lVar19;
                  do {
                    lVar20 = (long)((int)lVar20 - (int)uVar18) /
                             *(long *)((long)GA->dims + lVar13 * 8 + local_2e0 + -0x38);
                    uVar18 = (long)(int)lVar20 %
                             *(long *)((long)GA->dims + lVar13 * 8 + local_2e0 + -0x30);
                    *(int *)((long)&local_1d8 + lVar13 * 4 + 4) = (int)uVar18;
                    lVar13 = lVar13 + 1;
                  } while ((uVar17 & 0xffffffff) - 1 != lVar13);
                }
                local_378 = lVar19;
                if (0 < (short)uVar4) {
                  lVar20 = 0;
                  do {
                    iVar15 = *(int *)((long)&local_1d8 + lVar20);
                    lVar13 = *(long *)((long)GA->dims + lVar20 * 2 + local_278 + -0x30);
                    *(long *)((long)alStack_220 + lVar20 * 2 + 8U) = lVar13 * iVar15 + 1;
                    lVar13 = ((long)iVar15 + 1) * lVar13;
                    *(long *)((long)local_258 + lVar20 * 2) = lVar13;
                    lVar22 = *(long *)((long)GA + lVar20 * 2 + local_278 + -0x1f8);
                    if (lVar22 <= lVar13) {
                      lVar13 = lVar22;
                    }
                    *(long *)((long)local_258 + lVar20 * 2) = lVar13;
                    lVar20 = lVar20 + 4;
                  } while ((uVar17 & 0xffffffff) << 2 != lVar20);
                }
              }
              else if (iVar15 == 4) {
                uVar18 = local_2d0 % GA[lVar1].num_blocks[0];
                local_1d8._0_4_ = (int)uVar18;
                if (1 < (short)uVar4) {
                  uVar18 = uVar18 & 0xffffffff;
                  lVar13 = 0;
                  lVar20 = lVar19;
                  do {
                    lVar20 = (long)((int)lVar20 - (int)uVar18) /
                             *(long *)((long)GA->dims + lVar13 * 8 + local_2e0 + -0x38);
                    uVar18 = (long)(int)lVar20 %
                             *(long *)((long)GA->dims + lVar13 * 8 + local_2e0 + -0x30);
                    *(int *)((long)&local_1d8 + lVar13 * 4 + 4) = (int)uVar18;
                    lVar13 = lVar13 + 1;
                  } while ((uVar17 & 0xffffffff) - 1 != lVar13);
                }
                local_378 = lVar19;
                if (0 < (short)uVar4) {
                  pCVar6 = GA[lVar1].mapc;
                  lVar20 = 0;
                  iVar15 = 0;
                  do {
                    iVar5 = *(int *)((long)&local_1d8 + lVar20);
                    lVar13 = (long)iVar15 + (long)iVar5;
                    *(C_Integer *)((long)alStack_220 + lVar20 * 2 + 8U) = pCVar6[lVar13];
                    if ((long)iVar5 < *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2) + -1) {
                      lVar13 = GA[lVar1].mapc[lVar13 + 1] + -1;
                    }
                    else {
                      lVar13 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
                    }
                    *(long *)((long)local_258 + lVar20 * 2) = lVar13;
                    iVar15 = iVar15 + *(int *)((long)GA[lVar1].num_blocks + lVar20 * 2);
                    lVar20 = lVar20 + 4;
                  } while ((uVar17 & 0xffffffff) << 2 != lVar20);
                }
              }
              else {
                local_378 = lVar19;
                if (iVar15 == 0) {
                  if (GA[lVar1].num_rstrctd == 0) {
                    if ((short)uVar4 < 1) {
                      lVar20 = 1;
                    }
                    else {
                      lVar20 = 1;
                      uVar18 = 0;
                      do {
                        lVar20 = lVar20 * *(int *)((long)GA->dims + uVar18 * 4 + local_2e8 + -0x30);
                        uVar18 = uVar18 + 1;
                      } while (uVar17 != uVar18);
                    }
                    if (lVar19 < lVar20) {
                      if (0 < (short)uVar4) {
                        pCVar6 = GA[lVar1].mapc;
                        lVar13 = 0;
                        uVar18 = 0;
                        lVar20 = lVar19;
                        do {
                          lVar23 = (long)*(int *)((long)GA[1000].nblock + uVar18 * 4 + local_2f0);
                          lVar22 = lVar20 % lVar23;
                          alStack_220[uVar18 + 1] = pCVar6[lVar22 + lVar13];
                          if (lVar22 == lVar23 + -1) {
                            lVar22 = *(long *)((long)GA[1000].dims + uVar18 * 8 + local_2f0);
                          }
                          else {
                            lVar22 = pCVar6[lVar22 + lVar13 + 1] + -1;
                          }
                          lVar13 = lVar13 + lVar23;
                          local_258[uVar18] = lVar22;
                          uVar18 = uVar18 + 1;
                          lVar20 = lVar20 / lVar23;
                        } while (uVar17 != uVar18);
                      }
                    }
                    else {
LAB_001772fd:
                      if (0 < (short)uVar4) {
                        memset(alStack_220 + 1,0,uVar17 * 8);
LAB_0017732d:
                        memset(local_258,0xff,uVar17 * 8);
                      }
                    }
                  }
                  else if (lVar19 < GA[lVar1].num_rstrctd) {
                    if ((short)uVar4 < 1) {
                      lVar20 = 1;
                    }
                    else {
                      lVar20 = 1;
                      uVar18 = 0;
                      do {
                        lVar20 = lVar20 * *(int *)((long)GA->dims + uVar18 * 4 + local_2e8 + -0x30);
                        uVar18 = uVar18 + 1;
                      } while (uVar17 != uVar18);
                    }
                    if (lVar20 <= lVar19) goto LAB_001772fd;
                    if (0 < (short)uVar4) {
                      pCVar6 = GA[lVar1].mapc;
                      lVar13 = 0;
                      uVar18 = 0;
                      lVar20 = lVar19;
                      do {
                        lVar23 = (long)*(int *)((long)GA[1000].nblock + uVar18 * 4 + local_2f0);
                        lVar22 = lVar20 % lVar23;
                        alStack_220[uVar18 + 1] = pCVar6[lVar22 + lVar13];
                        if (lVar22 == lVar23 + -1) {
                          lVar22 = *(long *)((long)GA[1000].dims + uVar18 * 8 + local_2f0);
                        }
                        else {
                          lVar22 = pCVar6[lVar22 + lVar13 + 1] + -1;
                        }
                        lVar13 = lVar13 + lVar23;
                        local_258[uVar18] = lVar22;
                        uVar18 = uVar18 + 1;
                        lVar20 = lVar20 / lVar23;
                      } while (uVar17 != uVar18);
                    }
                  }
                  else if (0 < (short)uVar4) {
                    memset(alStack_220 + 1,0,(ulong)uVar4 << 3);
                    goto LAB_0017732d;
                  }
                }
              }
              iVar15 = pgVar8[lVar1].p_handle;
              if (0 < GA[lVar1].ndim) {
                lVar20 = 0;
                local_2fc = pgVar8[lVar1].p_handle;
                do {
                  if ((pIVar9[lVar20] < alStack_220[lVar20 + 1]) ||
                     (local_258[lVar20] < pIVar9[lVar20])) {
                    sprintf((char *)&local_1d8,"check subscript failed:%ld not in (%ld:%ld) dim=%d")
                    ;
                    pnga_error((char *)&local_1d8,lVar20);
                  }
                  lVar20 = lVar20 + 1;
                  iVar15 = local_2fc;
                } while (lVar20 < GA[lVar1].ndim);
              }
              if ((short)local_348 < 2) {
                lVar20 = 1;
                lVar13 = 0;
              }
              else {
                lVar20 = 1;
                lVar22 = 0;
                lVar13 = 0;
                do {
                  lVar23 = *(long *)((long)GA->dims + lVar22 * 8 + local_270 + -0x30);
                  lVar13 = lVar13 + ((lVar23 + pIVar9[lVar22]) - alStack_220[lVar22 + 1]) * lVar20;
                  lVar20 = lVar20 * (((lVar23 * 2 + 1) - alStack_220[lVar22 + 1]) +
                                    local_258[lVar22]);
                  lVar22 = lVar22 + 1;
                } while (uVar17 - 1 != lVar22);
              }
              CVar14 = lVar19;
              if (iVar15 == 0) {
                CVar14 = (C_Integer)PGRP_LIST->inv_map_proc_list[lVar19];
              }
              if (0 < GA[lVar1].num_rstrctd) {
                CVar14 = GA[lVar1].rstrctd_list[CVar14];
              }
              local_370[lVar16] =
                   GA[lVar1].ptr[CVar14] +
                   (long)GA[lVar1].elemsize *
                   (((pIVar9[local_348 - 1] - alStack_220[local_348]) + GA[lVar1].width[uVar17 - 1])
                    * lVar20 + lVar13);
              IVar24 = local_310;
            }
            else {
              lVar10 = pnga_locate(local_308,pIVar9,&local_378);
              if (lVar10 == 0) {
                gai_print_subscript("invalid subscript for block-cyclic array",(int)local_350,pIVar9
                                    ,"\n");
                pnga_error("failed -element:",local_3a8);
              }
              pnga_distribution(g_a_00,local_378,local_d8,local_68);
              ptr = local_370 + lVar16;
              pnga_access_block_ptr(g_a_00,local_378,ptr,local_98);
              lVar20 = 1;
              if ((short)local_368 < 2) {
                lVar13 = 0;
              }
              else {
                uVar17 = 0;
                lVar13 = 0;
                do {
                  lVar13 = lVar13 + (pIVar9[uVar17] - local_d8[uVar17]) * lVar20;
                  lVar20 = lVar20 * local_98[uVar17];
                  uVar17 = uVar17 + 1;
                } while (local_268 != uVar17);
              }
              *ptr = (void *)((long)*ptr +
                             ((pIVar9[local_368 + -1] - local_d8[local_368 + -1]) * lVar20 + lVar13)
                             * local_330);
            }
            local_380[lVar16] = (void *)(local_3a8 * local_330 + (long)local_260);
            local_3a8 = local_340[local_3a8];
            lVar16 = lVar16 + 1;
            lVar20 = local_368;
          } while (-1 < local_3a8);
        }
        if (local_2d8 < 1) {
          local_378 = lVar19;
          if (-1 < (int)local_280) {
            local_378 = (long)PGRP_LIST[local_280].inv_map_proc_list[lVar19];
          }
        }
        else {
          local_378 = GA[lVar1].rstrctd_list[lVar19];
        }
        if (local_35c == -99) {
          local_328.bytes = local_360;
          local_328.src_ptr_array = local_380;
          local_328.dst_ptr_array = local_370;
          local_328.ptr_array_len = (int)local_388[lVar19];
          local_38c = ARMCI_PutV(&local_328,1,(int)local_378);
          if (local_38c == 0) {
LAB_001776cc:
            local_38c = 0;
            pIVar9 = local_388;
          }
          else {
            pcVar21 = "scatter failed in armci";
LAB_001776b4:
            pnga_error(pcVar21,(long)local_38c);
            pIVar9 = local_388;
          }
        }
        else {
          if (local_35c == -0x61) {
            local_328.bytes = local_360;
            local_328.src_ptr_array = local_380;
            local_328.dst_ptr_array = local_370;
            local_328.ptr_array_len = (int)local_388[lVar19];
            if (alpha != (void *)0x0) {
              if ((uint)local_290 < 7 && (local_399 & 1) == 0) {
                iVar15 = *(int *)(&DAT_001b9f18 + local_290 * 4);
              }
              else {
                pnga_error("type not supported",local_2f8);
                iVar15 = -1;
              }
              local_38c = ARMCI_AccV(iVar15,alpha,&local_328,1,(int)local_378);
            }
            if (local_38c == 0) {
              local_38c = 0;
              pIVar9 = local_388;
              goto LAB_00177747;
            }
            lVar16 = (long)local_38c;
            pcVar21 = "scatter_acc failed in armci";
          }
          else {
            if (local_35c == -0x62) {
              local_328.bytes = local_360;
              local_328.src_ptr_array = local_370;
              local_328.dst_ptr_array = local_380;
              local_328.ptr_array_len = (int)local_388[lVar19];
              local_38c = ARMCI_GetV(&local_328,1,(int)local_378);
              if (local_38c == 0) goto LAB_001776cc;
              pcVar21 = "gather failed in armci";
              goto LAB_001776b4;
            }
            pcVar21 = "operation not supported";
            lVar16 = local_288;
          }
          pnga_error(pcVar21,lVar16);
          pIVar9 = local_388;
        }
      }
LAB_00177747:
      lVar19 = lVar19 + 1;
    } while (lVar19 != local_398);
  }
  free(local_380);
  if (GA_prealloc_gatscat == 0) {
    pnga_free(local_388);
    pnga_free(local_340);
    pnga_free(local_358);
  }
  return;
}

Assistant:

void gai_gatscat_new(int op, Integer g_a, void* v, void *subscript,
                     Integer c_flag, Integer nv, double *locbytes,
                     double* totbytes, void *alpha)
{
    Integer handle=g_a+GA_OFFSET;
    int  ndim, i, j, k, type, item_size;
    Integer idx, p_handle, num_rstrctd;
    Integer *proc;
    Integer nprocs, me, iproc, tproc, index[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM-1];
    Integer jtot, last, offset;
    Integer *subscript_ptr;

    Integer *header, *list, *nelems;
    char *buf;
    void **ptr_rem, **ptr_loc; 
    int rc, maxlen;
    int *nblock;
    armci_giov_t desc;

    

    me = pnga_nodeid();
    num_rstrctd = GA[handle].num_rstrctd;
    nblock = GA[handle].nblock;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nprocs = GAnproc;
      if (num_rstrctd > 0) nprocs = num_rstrctd;
    } else {
      nprocs = PGRP_LIST[p_handle].map_nproc;
    }

    if (!GA_prealloc_gatscat) {
      header =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_header");
      list =(Integer *)pnga_malloc(nv, MT_F_INT, "ga_gat_list");
      nelems =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_nelems");
    } else {
      if (GA_prealloc_gatscat < nv)
        pnga_error("Gather/scatter vector exceeds allocation length ",
                   GA_prealloc_gatscat);
      header = (Integer*)GA_header;
      list = (Integer*)GA_list;
      nelems = (Integer*)GA_elems;
    }

    ndim = GA[handle].ndim;
    type = GA[handle].type;
    item_size = GA[handle].elemsize;
    *totbytes = item_size * nv;

    /* Initialize linked list data structures */
    for (i=0; i<nprocs; i++) {
      nelems[i] = 0;
      header[i] = -1;
    }
    for (i=0; i<nv; i++) {
      list[i] = 0;
    }

    /* Set up linked list that partitions elements defined in subscripts array
     * into groups corresponding to the elements home processor
     */
    maxlen = 1;
    for (i=0; i<nv; i++) {
      if (c_flag) {
        gam_c2f_index(((int**)subscript)[i], index, ndim);
        subscript_ptr = index;
      } else {
        subscript_ptr = ((Integer*)subscript)+i*ndim;
      }
      if(!pnga_locate(g_a, subscript_ptr, &idx)) {
        gai_print_subscript("invalid subscript",ndim, subscript_ptr,"\n");
        pnga_error("failed -element:",i);
      }
      if (num_rstrctd > 0) idx = GA[handle].rank_rstrctd[idx];
      /* map from block to processor, if necessary */
      if (GA[handle].distr_type == BLOCK_CYCLIC) {
        idx = idx%nprocs;
      } else if (GA[handle].distr_type == SCALAPACK) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_proc_from_sl_indices(handle,idx,index);
      } else if (GA[handle].distr_type == TILED ||
          GA[handle].distr_type == TILED_IRREG) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_tile_proc_from_indices(handle,idx,index);
      }
      nelems[idx]++;
      if (maxlen<nelems[idx]) maxlen=nelems[idx];
      j = header[idx];
      header[idx] = i;
      list[i] = j;
    }
    *locbytes = item_size * nelems[me];

    /* allocate buffers for individual vector calls */
    buf = (char*)malloc(2*maxlen*sizeof(void*));
    ptr_loc = (void**)buf;
    ptr_rem = (void**)(buf+maxlen*sizeof(void*));

    for (iproc=0; iproc<nprocs; iproc++) {
      if (nelems[iproc] > 0) {
        /* loop through linked list to find all data elements associated with
         * the remote processor iproc
         */
        idx = header[iproc];
        j = 0;
        while (idx > -1) {
          if (c_flag) {
            gam_c2f_index(((int**)subscript)[idx], index, ndim);
            subscript_ptr = index;
          } else {
            subscript_ptr = ((Integer*)subscript)+idx*ndim;
          }
          if (GA[handle].distr_type == REGULAR) {
          /* gam_Loc_ptr modifies the value of the processor variable for
           * restricted arrays or processor groups, so make a temporary copy
           */
            tproc = iproc;
            gam_Loc_ptr(tproc, handle,  (subscript_ptr),
                ptr_rem+j);
          } else {
            /* TODO: Figure out how to get correct pointers for block cyclic
             * distributions */
            /* find block index from subscript */
            if(!pnga_locate(g_a, subscript_ptr, &tproc)) {
              gai_print_subscript("invalid subscript for block-cyclic array",
                                   ndim, subscript_ptr,"\n");
              pnga_error("failed -element:",idx);
            }
            pnga_distribution(g_a, tproc, lo, hi);
            pnga_access_block_ptr(g_a, tproc, ptr_rem+j, ld);
            pnga_release_block(g_a, tproc);
            offset = 0;
            last = ndim -1;
            jtot = 1;
            for (k=0; k<last; k++) {
              offset += ((subscript_ptr)[k]-lo[k])*jtot;
              jtot *= ld[k];
            }
            offset += ((subscript_ptr)[last]-lo[last])*jtot;
            ptr_rem[j] = (void*)(((char*)ptr_rem[j])+offset*item_size);
          }
          ptr_loc[j] = (void*)(((char*)v) + idx * item_size);
          idx = list[idx];
          j++;
        }
        /* correct remote proc if restricted arrays or processor groups are
         * being used
         */
        if (num_rstrctd > 0) {
          tproc = GA[handle].rstrctd_list[iproc];
        } else {
          if (p_handle < 0) {
            tproc = iproc;
          } else {
            tproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
          }
        }
        /* perform vector operation */
        switch(op) { 
          case GATHER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_rem;
            desc.dst_ptr_array = ptr_loc;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_GetV(&desc, 1, (int)tproc);
            if(rc) pnga_error("gather failed in armci",rc);
            break;
          case SCATTER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_PutV(&desc, 1, (int)tproc);
            if(rc) pnga_error("scatter failed in armci",rc);
            break;
          case SCATTER_ACC:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            if(alpha != NULL) {
              int optype=-1;
              if(type==C_DBL) optype= ARMCI_ACC_DBL;
              else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
              else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
              else if(type==C_INT)optype= ARMCI_ACC_INT;
              else if(type==C_LONG)optype= ARMCI_ACC_LNG;
              else if(type==C_FLOAT)optype= ARMCI_ACC_FLT; 
              else pnga_error("type not supported",type);
              rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)tproc);
            }
            if(rc) pnga_error("scatter_acc failed in armci",rc);
            break;
          default: pnga_error("operation not supported",op);
        }
      }
    }
    free(buf);
    if (!GA_prealloc_gatscat) {
      pnga_free(nelems);
      pnga_free(list);
      pnga_free(header);
    }

}